

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

TokenType __thiscall
google::protobuf::io::Tokenizer::ConsumeNumber
          (Tokenizer *this,bool started_with_zero,bool started_with_dot)

{
  bool bVar1;
  TokenType TVar2;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  bool is_float;
  string *in_stack_ffffffffffffff18;
  string *message;
  Tokenizer *in_stack_ffffffffffffff20;
  Tokenizer *this_00;
  Tokenizer *in_stack_ffffffffffffff28;
  allocator *paVar3;
  undefined1 local_b9 [33];
  char *in_stack_ffffffffffffff68;
  Tokenizer *in_stack_ffffffffffffff70;
  string local_68 [55];
  allocator local_31;
  string local_30 [37];
  byte local_b;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_b = 0;
  if ((local_9 == 0) ||
     ((bVar1 = TryConsume(in_stack_ffffffffffffff28,(char)((ulong)in_stack_ffffffffffffff20 >> 0x38)
                         ), !bVar1 &&
      (bVar1 = TryConsume(in_stack_ffffffffffffff28,(char)((ulong)in_stack_ffffffffffffff20 >> 0x38)
                         ), !bVar1)))) {
    if (((local_9 & 1) == 0) ||
       (bVar1 = LookingAt<google::protobuf::io::(anonymous_namespace)::Digit>((Tokenizer *)0x6e796c)
       , !bVar1)) {
      if ((local_a & 1) == 0) {
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>
                  (in_stack_ffffffffffffff20);
        bVar1 = TryConsume(in_stack_ffffffffffffff28,
                           (char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
        if (bVar1) {
          local_b = 1;
          ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>
                    (in_stack_ffffffffffffff20);
        }
      }
      else {
        local_b = 1;
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>
                  (in_stack_ffffffffffffff20);
      }
      bVar1 = TryConsume(in_stack_ffffffffffffff28,(char)((ulong)in_stack_ffffffffffffff20 >> 0x38))
      ;
      if ((bVar1) ||
         (bVar1 = TryConsume(in_stack_ffffffffffffff28,
                             (char)((ulong)in_stack_ffffffffffffff20 >> 0x38)), bVar1)) {
        local_b = 1;
        bVar1 = TryConsume(in_stack_ffffffffffffff28,
                           (char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
        if (!bVar1) {
          TryConsume(in_stack_ffffffffffffff28,(char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
        }
        ConsumeOneOrMore<google::protobuf::io::(anonymous_namespace)::Digit>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      if (((*(byte *)(in_RDI + 0xb4) & 1) != 0) &&
         ((bVar1 = TryConsume(in_stack_ffffffffffffff28,
                              (char)((ulong)in_stack_ffffffffffffff20 >> 0x38)), bVar1 ||
          (bVar1 = TryConsume(in_stack_ffffffffffffff28,
                              (char)((ulong)in_stack_ffffffffffffff20 >> 0x38)), bVar1)))) {
        local_b = 1;
      }
    }
    else {
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::OctalDigit>
                (in_stack_ffffffffffffff20);
      bVar1 = LookingAt<google::protobuf::io::(anonymous_namespace)::Digit>((Tokenizer *)0x6e7989);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_30,"Numbers starting with leading zero must be in octal.",&local_31);
        AddError(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::__cxx11::string::~string(local_30);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>
                  (in_stack_ffffffffffffff20);
      }
    }
  }
  else {
    ConsumeOneOrMore<google::protobuf::io::(anonymous_namespace)::HexDigit>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  bVar1 = LookingAt<google::protobuf::io::(anonymous_namespace)::Letter>((Tokenizer *)0x6e7b47);
  if ((bVar1) && ((*(byte *)(in_RDI + 0xbc) & 1) != 0)) {
    paVar3 = (allocator *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Need space between number and identifier.",paVar3);
    AddError(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  else if (*(char *)(in_RDI + 0x80) == '.') {
    if ((local_b & 1) == 0) {
      message = (string *)local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_b9 + 1),"Hex and octal numbers must be integers.",
                 (allocator *)message);
      AddError(in_stack_ffffffffffffff20,message);
      std::__cxx11::string::~string((string *)(local_b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b9);
    }
    else {
      this_00 = (Tokenizer *)&stack0xffffffffffffff6f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff70,
                 "Already saw decimal point or exponent; can\'t have another one.",
                 (allocator *)this_00);
      AddError(this_00,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    }
  }
  TVar2 = TYPE_INTEGER;
  if ((local_b & 1) != 0) {
    TVar2 = TYPE_FLOAT;
  }
  return TVar2;
}

Assistant:

Tokenizer::TokenType Tokenizer::ConsumeNumber(bool started_with_zero,
                                              bool started_with_dot) {
  bool is_float = false;

  if (started_with_zero && (TryConsume('x') || TryConsume('X'))) {
    // A hex number (started with "0x").
    ConsumeOneOrMore<HexDigit>("\"0x\" must be followed by hex digits.");

  } else if (started_with_zero && LookingAt<Digit>()) {
    // An octal number (had a leading zero).
    ConsumeZeroOrMore<OctalDigit>();
    if (LookingAt<Digit>()) {
      AddError("Numbers starting with leading zero must be in octal.");
      ConsumeZeroOrMore<Digit>();
    }

  } else {
    // A decimal number.
    if (started_with_dot) {
      is_float = true;
      ConsumeZeroOrMore<Digit>();
    } else {
      ConsumeZeroOrMore<Digit>();

      if (TryConsume('.')) {
        is_float = true;
        ConsumeZeroOrMore<Digit>();
      }
    }

    if (TryConsume('e') || TryConsume('E')) {
      is_float = true;
      TryConsume('-') || TryConsume('+');
      ConsumeOneOrMore<Digit>("\"e\" must be followed by exponent.");
    }

    if (allow_f_after_float_ && (TryConsume('f') || TryConsume('F'))) {
      is_float = true;
    }
  }

  if (LookingAt<Letter>() && require_space_after_number_) {
    AddError("Need space between number and identifier.");
  } else if (current_char_ == '.') {
    if (is_float) {
      AddError(
          "Already saw decimal point or exponent; can't have another one.");
    } else {
      AddError("Hex and octal numbers must be integers.");
    }
  }

  return is_float ? TYPE_FLOAT : TYPE_INTEGER;
}